

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O1

bool sptk::SnPrintf<sptk::int24_t>
               (int24_t *data,string *print_format,size_t buffer_size,char *buffer)

{
  byte bVar1;
  char *__format;
  int iVar2;
  uint uVar3;
  bool bVar4;
  
  bVar4 = false;
  if (((buffer != (char *)0x0) && (bVar4 = false, buffer_size != 0)) &&
     (print_format->_M_string_length != 0)) {
    __format = (print_format->_M_dataplus)._M_p;
    bVar1 = data->value[2];
    if ((char)bVar1 < '\0') {
      uVar3 = ((uint)bVar1 * 0x10000 + (uint)CONCAT11(data->value[1],data->value[0])) - 0x1000000;
    }
    else {
      uVar3 = (uint)bVar1 * 0x10000 | (uint)data->value[0] | (uint)data->value[1] << 8;
    }
    iVar2 = snprintf(buffer,buffer_size,__format,(ulong)uVar3,(ulong)uVar3,(ulong)bVar1,__format);
    bVar4 = -1 < iVar2;
  }
  return bVar4;
}

Assistant:

bool SnPrintf(int24_t data, const std::string& print_format,
              std::size_t buffer_size, char* buffer) {
  if (print_format.empty() || 0 == buffer_size || NULL == buffer) {
    return false;
  }

  return (std::snprintf(buffer, buffer_size, print_format.c_str(),
                        static_cast<int>(data)) < 0)
             ? false
             : true;
}